

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::insertSpirvExecutionModeId
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  ulong uVar3;
  int iVar4;
  TPoolAllocator *pTVar5;
  TSpirvExecutionMode *pTVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  *this_00;
  undefined8 *puVar7;
  TIntermTyped *extraOperand;
  TVector<const_glslang::TIntermTyped_*> extraOperands;
  int local_64;
  TIntermTyped *local_60;
  vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  local_58;
  TIntermediate *local_38;
  
  local_64 = executionMode;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    pTVar5 = GetThreadPoolAllocator();
    pTVar6 = (TSpirvExecutionMode *)TPoolAllocator::allocate(pTVar5,0x70);
    pTVar5 = GetThreadPoolAllocator();
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar5;
    p_Var1 = &(pTVar6->modes).
              super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar6->modes).
    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pTVar5 = GetThreadPoolAllocator();
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Node_allocator.allocator = pTVar5;
    p_Var1 = &(pTVar6->modeIds).
              super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
              ._M_t._M_impl.super__Rb_tree_header;
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (pTVar6->modeIds).
    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this->spirvExecutionMode = pTVar6;
  }
  local_38 = this;
  if (args == (TIntermAggregate *)0x0) {
    __assert_fail("args",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                  ,0x8b,
                  "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
                 );
  }
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (TIntermTyped **)0x0;
  local_58.
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (TIntermTyped **)0x0;
  iVar4 = (*(args->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x33])(args);
  puVar7 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 8);
  puVar2 = *(undefined8 **)(CONCAT44(extraout_var,iVar4) + 0x10);
  if (puVar7 != puVar2) {
    do {
      local_60 = (TIntermTyped *)(**(code **)(*(long *)*puVar7 + 0x18))();
      if (local_60 == (TIntermTyped *)0x0) {
LAB_00442252:
        __assert_fail("extraOperand != nullptr && extraOperand->getQualifier().isConstant()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x90,
                      "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
                     );
      }
      iVar4 = (*(local_60->super_TIntermNode)._vptr_TIntermNode[0x21])(local_60);
      uVar3 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8);
      if ((uVar3 & 0x100000000) == 0 && (uVar3 & 0x10000007f) != 2) goto LAB_00442252;
      if (local_58.
          super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_58.
          super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<glslang::TIntermTyped_const*,glslang::pool_allocator<glslang::TIntermTyped_const*>>::
        _M_realloc_insert<glslang::TIntermTyped_const*const&>
                  ((vector<glslang::TIntermTyped_const*,glslang::pool_allocator<glslang::TIntermTyped_const*>>
                    *)&local_58,
                   (iterator)
                   local_58.
                   super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_58.
         super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_60;
        local_58.
        super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_58.
             super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  this_00 = &std::
             map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
             ::operator[](&(local_38->spirvExecutionMode->modeIds).
                           super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                          ,&local_64)->
             super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ;
  std::
  vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>::
  operator=(this_00,&local_58);
  return;
}

Assistant:

void TIntermediate::insertSpirvExecutionModeId(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    assert(args);
    TVector<const TIntermTyped*> extraOperands;

    for (auto arg : args->getSequence()) {
        auto extraOperand = arg->getAsTyped();
        assert(extraOperand != nullptr && extraOperand->getQualifier().isConstant());
        extraOperands.push_back(extraOperand);
    }
    spirvExecutionMode->modeIds[executionMode] = extraOperands;
}